

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_UnrecognizedExtraParameters_Test::
~CommandLineInterfaceTest_UnrecognizedExtraParameters_Test
          (CommandLineInterfaceTest_UnrecognizedExtraParameters_Test *this)

{
  CommandLineInterfaceTest_UnrecognizedExtraParameters_Test *this_local;
  
  CommandLineInterfaceTest::~CommandLineInterfaceTest(&this->super_CommandLineInterfaceTest);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, UnrecognizedExtraParameters) {
  CreateTempFile("foo.proto",
                 "syntax = \"proto2\";\n"
                 "message Foo {}\n");

  Run("protocol_compiler --plug_out=TestParameter:$tmpdir "
      "--unknown_plug_a_opt=Foo "
      "--unknown_plug_b_opt=Bar "
      "--proto_path=$tmpdir foo.proto");

  ExpectErrorSubstring("Unknown flag: --unknown_plug_a_opt");
  ExpectErrorSubstring("Unknown flag: --unknown_plug_b_opt");
}